

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_recv_creq(udp_ep *ep,udp_sp_creq *creq,nng_sockaddr *sa)

{
  nni_time nVar1;
  int iVar2;
  udp_sp_msg local_4c;
  udp_pipe *local_38;
  udp_pipe *p;
  
  nVar1 = nni_clock();
  local_4c.data.us_peer_id = creq->us_sender_id;
  local_4c.data.us_sender_id = creq->us_peer_id;
  if (ep->dialer == true) {
    local_4c.data.us_type = ep->proto;
  }
  else {
    local_38 = (udp_pipe *)nni_id_get(&ep->pipes,(ulong)local_4c.data.us_sender_id);
    if (((local_38 == (udp_pipe *)0x0) || (local_38->closed != false)) ||
       (local_38->peer_id != local_4c.data.us_peer_id && local_38->peer_id != 0)) {
      local_38 = (udp_pipe *)0x0;
    }
    if (local_38 != (udp_pipe *)0x0) {
      if (local_38->peer_id == 0) {
        return;
      }
      if (local_38->peer != creq->us_type) {
        return;
      }
      if (creq->us_refresh == 0) {
        udp_send_disc(ep,local_38,DISC_NEGO);
        return;
      }
      iVar2 = (uint)creq->us_refresh * 1000;
      if (iVar2 < local_38->refresh) {
        local_38->refresh = iVar2;
      }
      local_38->next_wake = nVar1 + (long)local_38->refresh;
      local_38->expire = (long)local_38->refresh * 5 + nVar1;
      udp_pipe_schedule(local_38);
      udp_send_cack(ep,local_38);
      return;
    }
    if ((ep->fini == false) && (ep->closed != true)) {
      if (creq->us_refresh == '\0') {
        local_4c.data.us_peer_id = creq->us_sender_id;
        local_4c.data.us_type = ep->proto;
        local_4c.data.us_sender_id = 0;
        local_4c.data.us_length = 5;
      }
      else {
        iVar2 = nni_pipe_alloc_listener(&local_38,ep->nlistener);
        if (iVar2 == 0) {
          iVar2 = udp_pipe_start(local_38,ep,sa);
          if (iVar2 != 0) {
            local_4c.data.us_peer_id = creq->us_sender_id;
            local_4c._0_2_ = 0x301;
            local_4c.data.us_type = ep->proto;
            local_4c.data.us_sender_id = 0;
            local_4c.data.us_sequence = 0;
            local_4c.data.us_length = 8;
            udp_queue_tx(ep,sa,&local_4c,(nni_msg *)0x0);
            nni_pipe_close(local_38->npipe);
            return;
          }
          iVar2 = (uint)creq->us_refresh * 1000;
          if (iVar2 < local_38->refresh) {
            local_38->refresh = iVar2;
          }
          local_38->peer = creq->us_type;
          local_38->peer_id = creq->us_sender_id;
          local_38->peer_seq = creq->us_sequence + 1;
          local_38->sndmax = creq->us_recv_max;
          local_38->next_wake = nVar1 + (long)local_38->refresh;
          udp_pipe_schedule(local_38);
          nni_list_append(&ep->connpipes,local_38);
          udp_send_cack(ep,local_38);
          udp_ep_match(ep);
          return;
        }
        local_4c.data.us_peer_id = creq->us_sender_id;
        local_4c.data.us_type = ep->proto;
        local_4c.data.us_sender_id = 0;
        local_4c.data.us_length = 8;
      }
      goto LAB_0012e71e;
    }
    local_4c.data.us_peer_id = creq->us_sender_id;
    local_4c.data.us_type = ep->proto;
    local_4c.data.us_sender_id = 0;
  }
  local_4c.data.us_length = 3;
LAB_0012e71e:
  local_4c.data.us_sequence = 0;
  local_4c._0_2_ = 0x301;
  udp_queue_tx(ep,sa,&local_4c,(nni_msg *)0x0);
  return;
}

Assistant:

static void
udp_recv_creq(udp_ep *ep, udp_sp_creq *creq, nng_sockaddr *sa)
{
	udp_pipe *p;
	nni_time  now;

	now = nni_clock();
	if (ep->dialer) {
		// dialers do not accept CREQ requests
		udp_send_disc_full(ep, sa, creq->us_peer_id,
		    creq->us_sender_id, 0, DISC_REFUSED);
		return;
	}
	if ((p = udp_find_pipe(ep, creq->us_peer_id, creq->us_sender_id))) {
		if ((p->peer_id == 0) || (p->peer != creq->us_type)) {
			// we don't expect this -- a connection request from a
			// peer while we have an oustanding request of our own.
			// We *could* compare the sockaddrs to see if they
			// match and if so then treat this as just a dueling
			// connection. but for now we just discard it -- we'll
			// wait for the CACK.
			return;
		}

		// so we know who it is from.. this is a refresh.
		if (creq->us_refresh == 0) {
			udp_send_disc(ep, p, DISC_NEGO);
			return;
		}
		if ((creq->us_refresh * NNI_SECOND) < p->refresh) {
			p->refresh = creq->us_refresh * NNI_SECOND;
		}
		p->next_wake = now + UDP_PIPE_REFRESH(p);
		p->expire    = now + UDP_PIPE_TIMEOUT(p);

		udp_pipe_schedule(p);
		udp_send_cack(ep, p);
		return;
	}

	// new pipe
	if (ep->fini || ep->closed) {
		// endpoint is closing down, reject it.
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_REFUSED);
		return;
	}
	if (creq->us_refresh == 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NEGO);
		return;
	}

	if (nni_pipe_alloc_listener((void **) &p, ep->nlistener) != 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NOBUF);
		return;
	}
	if (udp_pipe_start(p, ep, sa) != 0) {
		udp_send_disc_full(
		    ep, sa, 0, creq->us_sender_id, 0, DISC_NOBUF);
		nni_pipe_close(p->npipe);
		return;
	}

	if ((creq->us_refresh * NNI_SECOND) < p->refresh) {
		p->refresh = (creq->us_refresh * NNI_SECOND);
	}
	p->peer      = creq->us_type;
	p->peer_id   = creq->us_sender_id;
	p->peer_seq  = creq->us_sequence + 1;
	p->sndmax    = creq->us_recv_max;
	p->next_wake = now + UDP_PIPE_REFRESH(p);

	udp_pipe_schedule(p);
	nni_list_append(&ep->connpipes, p);
	udp_send_cack(ep, p);
	udp_ep_match(ep);
}